

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

void __thiscall capnp::LocalClient::startResolveTask(LocalClient *this,Server *serverRef)

{
  ForkHub<kj::_::Void> *pFVar1;
  Disposer *pDVar2;
  undefined8 uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<capnp::Capability::Client>_>_2 node;
  Maybe<kj::ForkedPromise<void>_> local_48;
  Maybe<kj::Promise<capnp::Capability::Client>_> local_30;
  anon_class_8_1_8991fb9c local_20;
  
  (*serverRef->_vptr_Server[2])(&local_30);
  local_20.this = this;
  kj::Maybe<kj::Promise<capnp::Capability::Client>_>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:743:47)>
            (&local_48,&local_30,&local_20);
  if (&local_48 != &this->resolveTask) {
    if ((this->resolveTask).ptr.isSet == true) {
      (this->resolveTask).ptr.isSet = false;
      pFVar1 = (this->resolveTask).ptr.field_1.value.hub.ptr;
      if (pFVar1 != (ForkHub<kj::_::Void> *)0x0) {
        (this->resolveTask).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
        pDVar2 = (this->resolveTask).ptr.field_1.value.hub.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                                  _vptr_PromiseArenaMember +
                          (long)(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                                _vptr_PromiseArenaMember[-2]));
      }
    }
    if (local_48.ptr.isSet == true) {
      (this->resolveTask).ptr.field_1.value.hub.disposer = local_48.ptr.field_1.value.hub.disposer;
      (this->resolveTask).ptr.field_1.value.hub.ptr = local_48.ptr.field_1.value.hub.ptr;
      local_48.ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
      (this->resolveTask).ptr.isSet = true;
    }
  }
  uVar3 = local_48.ptr.field_1.value.hub.ptr;
  if (local_48.ptr.isSet == true) {
    local_48.ptr.isSet = false;
    if (local_48.ptr.field_1.value.hub.ptr != (ForkHub<kj::_::Void> *)0x0) {
      local_48.ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
      (**(local_48.ptr.field_1.value.hub.disposer)->_vptr_Disposer)
                (local_48.ptr.field_1.value.hub.disposer,
                 (_func_int *)
                 ((long)&(((ForkHub<kj::_::Void> *)uVar3)->super_ForkHubBase).
                         super_PromiseArenaMember._vptr_PromiseArenaMember +
                 (long)(((ForkHub<kj::_::Void> *)uVar3)->super_ForkHubBase).super_PromiseArenaMember
                       ._vptr_PromiseArenaMember[-2]));
    }
  }
  uVar3 = local_48.ptr.field_1.value.hub.ptr;
  if ((local_48.ptr.isSet == true) &&
     (local_48.ptr.field_1.value.hub.ptr != (ForkHub<kj::_::Void> *)0x0)) {
    local_48.ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    (**(local_48.ptr.field_1.value.hub.disposer)->_vptr_Disposer)
              (local_48.ptr.field_1.value.hub.disposer,
               (_func_int *)
               ((long)&(((ForkHub<kj::_::Void> *)uVar3)->super_ForkHubBase).super_PromiseArenaMember
                       ._vptr_PromiseArenaMember +
               (long)(((ForkHub<kj::_::Void> *)uVar3)->super_ForkHubBase).super_PromiseArenaMember.
                     _vptr_PromiseArenaMember[-2]));
  }
  node = local_30.ptr.field_1;
  if ((local_30.ptr.isSet == true) &&
     (local_30.ptr.field_1 !=
      (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<capnp::Capability::Client>_>_2)0x0)) {
    local_30.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<capnp::Capability::Client>_>_2)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  return;
}

Assistant:

void startResolveTask(Capability::Server& serverRef) {
    resolveTask = serverRef.shortenPath().map([this](kj::Promise<Capability::Client> promise) {
      KJ_IF_SOME(r, revoker) {
        promise = r.wrap(kj::mv(promise));
      }

      return promise.then([this](Capability::Client&& cap) {
        auto hook = ClientHook::from(kj::mv(cap));

        if (blocked) {
          // This is a streaming interface and we have some calls queued up as a result. We cannot
          // resolve directly to the new shorter path because this may allow new calls to hop
          // the queue -- we need to embargo new calls until the queue clears out.
          auto promise = kj::newAdaptedPromise<kj::Promise<void>, BlockedCall>(*this)
              .then([hook = kj::mv(hook)]() mutable { return kj::mv(hook); });
          hook = newLocalPromiseClient(kj::mv(promise));
        }

        resolved = kj::mv(hook);
      }).fork();
    });
  }